

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void enqueue_tile_jobs(AV1Decoder *pbi,AV1_COMMON *cm,int tile_rows_start,int tile_rows_end,
                      int tile_cols_start,int tile_cols_end,int start_tile,int end_tile)

{
  int col;
  int row;
  TileJobsDec *tile_job_queue;
  AV1DecTileMT *tile_mt_info;
  int tile_cols_end_local;
  int tile_cols_start_local;
  int tile_rows_end_local;
  int tile_rows_start_local;
  AV1_COMMON *cm_local;
  AV1Decoder *pbi_local;
  
  tile_job_queue = (pbi->tile_mt_info).job_queue;
  (pbi->tile_mt_info).jobs_enqueued = 0;
  (pbi->tile_mt_info).jobs_dequeued = 0;
  for (row = tile_rows_start; col = tile_cols_start, row < tile_rows_end; row = row + 1) {
    for (; col < tile_cols_end; col = col + 1) {
      if ((start_tile <= row * (cm->tiles).cols + col) && (row * (cm->tiles).cols + col <= end_tile)
         ) {
        tile_job_queue->tile_buffer = pbi->tile_buffers[row] + col;
        tile_job_queue->tile_data = pbi->tile_data + (long)(row * (cm->tiles).cols) + (long)col;
        tile_job_queue = tile_job_queue + 1;
        (pbi->tile_mt_info).jobs_enqueued = (pbi->tile_mt_info).jobs_enqueued + 1;
      }
    }
  }
  return;
}

Assistant:

static inline void enqueue_tile_jobs(AV1Decoder *pbi, AV1_COMMON *cm,
                                     int tile_rows_start, int tile_rows_end,
                                     int tile_cols_start, int tile_cols_end,
                                     int start_tile, int end_tile) {
  AV1DecTileMT *tile_mt_info = &pbi->tile_mt_info;
  TileJobsDec *tile_job_queue = tile_mt_info->job_queue;
  tile_mt_info->jobs_enqueued = 0;
  tile_mt_info->jobs_dequeued = 0;

  for (int row = tile_rows_start; row < tile_rows_end; row++) {
    for (int col = tile_cols_start; col < tile_cols_end; col++) {
      if (row * cm->tiles.cols + col < start_tile ||
          row * cm->tiles.cols + col > end_tile)
        continue;
      tile_job_queue->tile_buffer = &pbi->tile_buffers[row][col];
      tile_job_queue->tile_data = pbi->tile_data + row * cm->tiles.cols + col;
      tile_job_queue++;
      tile_mt_info->jobs_enqueued++;
    }
  }
}